

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession.c
# Opt level: O3

int mg_session_ensure_space_for_chunk(mg_session *session,size_t chunk_size)

{
  char *buf;
  size_t sVar1;
  
  sVar1 = session->in_capacity;
  if (sVar1 - session->in_end < chunk_size) {
    buf = session->in_buffer;
    do {
      buf = (char *)mg_allocator_realloc(session->allocator,buf,sVar1 * 2);
      if (buf == (char *)0x0) {
        mg_session_set_error(session,"failed to enlarge incoming message buffer");
        return -3;
      }
      sVar1 = session->in_capacity * 2;
      session->in_capacity = sVar1;
      session->in_buffer = buf;
    } while (sVar1 - session->in_end < chunk_size);
  }
  return 0;
}

Assistant:

int mg_session_ensure_space_for_chunk(mg_session *session, size_t chunk_size) {
  while (session->in_capacity - session->in_end < chunk_size) {
    char *new_in_buffer = mg_allocator_realloc(
        session->allocator, session->in_buffer, 2 * session->in_capacity);
    if (!new_in_buffer) {
      mg_session_set_error(session,
                           "failed to enlarge incoming message buffer");
      return MG_ERROR_OOM;
    }
    session->in_capacity = 2 * session->in_capacity;
    session->in_buffer = new_in_buffer;
  }
  return 0;
}